

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_save.cpp
# Opt level: O0

void save_string_proc(ostream *os,Am_Load_Save_Context *context,Am_Value *value)

{
  char *__s;
  size_t sVar1;
  void *this;
  int local_44;
  int i;
  int length;
  char *string_val;
  Am_String string;
  Am_Value *value_local;
  Am_Load_Save_Context *context_local;
  ostream *os_local;
  
  string.data = (Am_String_Data *)value;
  Am_Load_Save_Context::Save_Type_Name(context,os,"Am_STRING");
  Am_String::Am_String((Am_String *)&string_val,(Am_Value *)string.data);
  __s = Am_String::operator_cast_to_char_((Am_String *)&string_val);
  sVar1 = strlen(__s);
  this = (void *)std::ostream::operator<<(os,(int)sVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  for (local_44 = 0; local_44 < (int)sVar1; local_44 = local_44 + 1) {
    std::operator<<(os,__s[local_44]);
  }
  std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  Am_String::~Am_String((Am_String *)&string_val);
  return;
}

Assistant:

Am_Define_Method(Am_Save_Method, void, save_string,
                 (std::ostream & os, Am_Load_Save_Context &context,
                  const Am_Value &value))
{
  context.Save_Type_Name(os, "Am_STRING");
  Am_String string = value;
  const char *string_val = string;
  int length = strlen(string_val);
  os << length << std::endl;
  int i;
  for (i = 0; i < length; ++i) {
    os << string_val[i];
  }
  os << std::endl;
}